

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O0

Cdr * __thiscall
eprosima::fastcdr::Cdr::deserialize(Cdr *this,char **string_t,Endianness endianness)

{
  bool bVar1;
  uint8_t in_DL;
  Cdr *in_RDI;
  Exception *ex;
  char **in_stack_00000020;
  Cdr *in_stack_00000028;
  bool auxSwap;
  bool local_3a;
  bool local_39;
  
  bVar1 = in_RDI->m_swapBytes;
  if (((in_RDI->m_swapBytes & 1U) == 0) || (local_39 = true, in_RDI->m_endianness != in_DL)) {
    local_3a = false;
    if ((in_RDI->m_swapBytes & 1U) == 0) {
      local_3a = in_RDI->m_endianness != in_DL;
    }
    local_39 = local_3a;
  }
  in_RDI->m_swapBytes = local_39;
  deserialize(in_stack_00000028,in_stack_00000020);
  in_RDI->m_swapBytes = (bool)(bVar1 & 1);
  return in_RDI;
}

Assistant:

Cdr& Cdr::deserialize(char *&string_t, Endianness endianness)
{
    bool auxSwap = m_swapBytes;
    m_swapBytes = (m_swapBytes && (m_endianness == endianness)) || (!m_swapBytes && (m_endianness != endianness));

    try
    {
        deserialize(string_t);
        m_swapBytes = auxSwap;
    }
    catch(Exception &ex)
    {
        m_swapBytes = auxSwap;
        ex.raise();
    }

    return *this;
}